

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkStartNameIds(Abc_Ntk_t *p)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  FILE *__stream;
  Vec_Int_t *pVVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *p_00;
  long *plVar8;
  int iVar9;
  int iVar10;
  char pFileName [1000];
  
  if (p->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2a9,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  if (p->vNameIds == (Vec_Int_t *)0x0) {
    pcVar4 = p->pSpec;
    sVar3 = strlen(pcVar4);
    if (sVar3 < 1000) {
      pcVar4 = Extra_FileNameGenericAppend(pcVar4,"");
      pcVar5 = Extra_FileNameExtension(p->pSpec);
      sprintf(pFileName,"%s_%s_names.txt",pcVar4,pcVar5);
      __stream = fopen(pFileName,"wb");
      pVVar6 = Vec_IntStart(p->vObjs->nSize);
      p->vNameIds = pVVar6;
      iVar9 = 2;
      for (iVar10 = 0; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
        pAVar7 = Abc_NtkCi(p,iVar10);
        pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray]);
        fprintf(__stream,"%s            \n",pcVar4);
        Vec_IntWriteEntry(p->vNameIds,pAVar7->Id,iVar9);
        iVar9 = iVar9 + 2;
      }
      iVar10 = iVar10 + 1;
      for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
        pAVar7 = Abc_NtkCo(p,iVar9);
        plVar8 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
        plVar8 = *(long **)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8);
        iVar2 = Vec_IntEntry(p->vNameIds,(int)plVar8[2]);
        if (iVar2 == 0) {
          pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                                (long)*(int *)plVar8[6] * 8));
          fprintf(__stream,"%s            \n",pcVar4);
          Vec_IntWriteEntry(p->vNameIds,(int)plVar8[2],iVar10 * 2);
          iVar10 = iVar10 + 1;
        }
      }
      p_00 = Abc_NtkDfs(p,1);
      for (iVar9 = 0; iVar9 < p_00->nSize; iVar9 = iVar9 + 1) {
        plVar8 = (long *)Vec_PtrEntry(p_00,iVar9);
        iVar2 = Vec_IntEntry(p->vNameIds,(int)plVar8[2]);
        if (iVar2 == 0) {
          pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                                (long)*(int *)plVar8[6] * 8));
          fprintf(__stream,"%s            \n",pcVar4);
          Vec_IntWriteEntry(p->vNameIds,(int)plVar8[2],iVar10 * 2);
          iVar10 = iVar10 + 1;
        }
      }
      Vec_PtrFree(p_00);
      fclose(__stream);
      for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
        pAVar7 = Abc_NtkCo(p,iVar9);
        plVar8 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
        lVar1 = *(long *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8);
        pVVar6 = p->vNameIds;
        iVar10 = pAVar7->Id;
        iVar2 = Vec_IntEntry(pVVar6,*(int *)(lVar1 + 0x10));
        Vec_IntWriteEntry(pVVar6,iVar10,iVar2);
        Vec_IntWriteEntry(p->vNameIds,*(int *)(lVar1 + 0x10),0);
      }
      return;
    }
    __assert_fail("strlen(p->pSpec) < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2ab,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  __assert_fail("p->vNameIds == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                ,0x2aa,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkStartNameIds( Abc_Ntk_t * p )
{
    char pFileName[1000];
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, Counter = 1;
    assert( Abc_NtkIsNetlist(p) );
    assert( p->vNameIds == NULL );
    assert( strlen(p->pSpec) < 1000 );
    sprintf( pFileName, "%s_%s_names.txt", Extra_FileNameGenericAppend(p->pSpec,""), Extra_FileNameExtension(p->pSpec) );
    pFile = fopen( pFileName, "wb" );
    p->vNameIds = Vec_IntStart( Abc_NtkObjNumMax(p) );
    // add inputs
    Abc_NtkForEachCi( p, pObj, i )
        fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pObj)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pObj), 2*Counter++);
    // add outputs
    Abc_NtkForEachCo( p, pObj, i )
    {
        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        if ( !Vec_IntEntry(p->vNameIds, Abc_ObjId(pFanin)) )
            fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pFanin)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pFanin), 2*Counter++);
    }
    // add nodes in a topo order
    vNodes = Abc_NtkDfs( p, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Vec_IntEntry(p->vNameIds, Abc_ObjId(pObj)) )
            fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pObj)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pObj), 2*Counter++);
    Vec_PtrFree( vNodes );
    fclose( pFile );
    // transfer driver node names to COs
    Abc_NtkForEachCo( p, pObj, i )
    {
        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        Vec_IntWriteEntry( p->vNameIds, Abc_ObjId(pObj), Vec_IntEntry(p->vNameIds, Abc_ObjId(pFanin)) );
        Vec_IntWriteEntry( p->vNameIds, Abc_ObjId(pFanin), 0 );
    }
}